

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O0

void __thiscall ViewTest::copyConstructorTest(ViewTest *this)

{
  undefined1 *puVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  reference piVar5;
  reference piVar6;
  reference piVar7;
  reference piVar8;
  reference pvVar9;
  iterator iVar10;
  iterator iVar11;
  ulong uVar12;
  size_type sVar13;
  bool local_10b9;
  bool local_fd9;
  bool local_ef9;
  bool local_e29;
  bool local_d59;
  bool local_c89;
  bool local_bf1;
  bool local_b59;
  bool local_ac1;
  bool local_a69;
  bool local_a29;
  bool local_9e9;
  bool local_9c1;
  ulong local_9c0;
  size_t p_2;
  size_t k_5;
  size_t j_23;
  ulong local_9a0;
  size_t j_22;
  undefined1 local_990 [4];
  unsigned_short j_21;
  View<int,_true,_std::allocator<unsigned_long>_> w_11;
  undefined1 local_938 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_11;
  undefined1 local_8f0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_8;
  ulong local_8d0;
  size_t p_1;
  size_t k_4;
  size_t j_20;
  ulong local_8b0;
  size_t j_19;
  undefined1 local_8a0 [4];
  unsigned_short j_18;
  View<int,_true,_std::allocator<unsigned_long>_> w_10;
  undefined1 local_848 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_10;
  undefined1 local_800 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_7;
  ulong local_7e0;
  size_t p;
  size_t k_3;
  size_t j_17;
  ulong local_7c0;
  size_t j_16;
  undefined1 local_7b0 [4];
  unsigned_short j_15;
  View<int,_false,_std::allocator<unsigned_long>_> w_9;
  undefined1 local_758 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_9;
  undefined1 local_710 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_6;
  ulong local_6f0;
  size_t k_2;
  size_t j_14;
  ulong local_6d8;
  size_t j_13;
  undefined1 local_6c8 [4];
  unsigned_short j_12;
  View<int,_true,_std::allocator<unsigned_long>_> w_8;
  undefined1 local_670 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_8;
  undefined1 local_628 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_5;
  ulong local_608;
  size_t k_1;
  size_t j_11;
  ulong local_5f0;
  size_t j_10;
  undefined1 local_5e0 [4];
  unsigned_short j_9;
  View<int,_true,_std::allocator<unsigned_long>_> w_7;
  undefined1 local_588 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_7;
  undefined1 local_540 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_4;
  ulong local_520;
  size_t k;
  size_t j_8;
  ulong local_508;
  size_t j_7;
  undefined1 local_4f8 [4];
  unsigned_short j_6;
  View<int,_false,_std::allocator<unsigned_long>_> w_6;
  undefined1 local_4a0 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_6;
  undefined1 local_458 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_3;
  size_t local_438;
  size_t j_5;
  undefined1 local_428 [4];
  unsigned_short j_4;
  View<int,_true,_std::allocator<unsigned_long>_> w_5;
  undefined1 local_3d0 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_5;
  undefined1 local_388 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_2;
  size_t local_368;
  size_t j_3;
  undefined1 local_358 [4];
  unsigned_short j_2;
  View<int,_true,_std::allocator<unsigned_long>_> w_4;
  undefined1 local_300 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_4;
  undefined1 local_2b8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_1;
  size_t local_298;
  size_t j_1;
  undefined1 local_288 [4];
  unsigned_short j;
  View<int,_false,_std::allocator<unsigned_long>_> w_3;
  undefined1 local_230 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_3;
  undefined1 local_1e8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  undefined1 local_1c8 [8];
  View<int,_true,_std::allocator<unsigned_long>_> w_2;
  undefined1 local_180 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_2;
  undefined1 local_138 [8];
  View<int,_true,_std::allocator<unsigned_long>_> w_1;
  undefined1 local_f0 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_1;
  undefined1 local_a8 [8];
  View<int,_false,_std::allocator<unsigned_long>_> w;
  allocator<int> local_51;
  undefined1 local_50 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v;
  ViewTest *this_local;
  
  v.geometry_._48_8_ = this;
  std::allocator<int>::allocator(&local_51);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_50,&this->scalar_,&local_51);
  std::allocator<int>::~allocator(&local_51);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a8,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_50);
  sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a8);
  sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_50);
  local_9e9 = false;
  if (sVar3 == sVar4) {
    sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a8);
    sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_50);
    local_9e9 = false;
    if (sVar3 == sVar4) {
      piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_a8,0);
      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_50,0);
      local_9e9 = piVar5 == piVar6;
    }
  }
  v_1.geometry_._55_1_ = local_9e9;
  test((bool *)&v_1.geometry_.field_0x37);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_50);
  puVar1 = &w_1.geometry_.field_0x37;
  std::allocator<int>::allocator((allocator<int> *)puVar1);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f0,&this->scalar_,
             (allocator_type *)puVar1);
  std::allocator<int>::~allocator((allocator<int> *)&w_1.geometry_.field_0x37);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_138,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_f0);
  sVar3 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_138);
  sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f0);
  local_a29 = false;
  if (sVar3 == sVar4) {
    sVar3 = andres::View<int,_true,_std::allocator<unsigned_long>_>::size
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_138);
    sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f0);
    local_a29 = false;
    if (sVar3 == sVar4) {
      piVar7 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)local_138,0);
      piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_f0,0);
      local_a29 = piVar7 == piVar5;
    }
  }
  v_2.geometry_._55_1_ = local_a29;
  test((bool *)&v_2.geometry_.field_0x37);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_138);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f0);
  puVar1 = &w_2.geometry_.field_0x37;
  std::allocator<int>::allocator((allocator<int> *)puVar1);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_180,&this->scalar_,
             (allocator_type *)puVar1);
  std::allocator<int>::~allocator((allocator<int> *)&w_2.geometry_.field_0x37);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1c8,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_180);
  sVar3 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1c8);
  sVar4 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_180);
  local_a69 = false;
  if (sVar3 == sVar4) {
    sVar3 = andres::View<int,_true,_std::allocator<unsigned_long>_>::size
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1c8);
    sVar4 = andres::View<int,_true,_std::allocator<unsigned_long>_>::size
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_180);
    local_a69 = false;
    if (sVar3 == sVar4) {
      piVar7 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)local_1c8,0);
      piVar8 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)local_180,0);
      local_a69 = piVar7 == piVar8;
    }
  }
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = local_a69;
  test((bool *)((long)&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1c8);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_180);
  puVar1 = &v_3.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1e8,1,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_3.geometry_.field_0x37);
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1e8,0);
  *pvVar9 = 0x18;
  iVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1e8);
  iVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1e8);
  puVar1 = &w_3.geometry_.field_0x37;
  std::allocator<int>::allocator((allocator<int> *)puVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_230,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar10._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar11._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)puVar1);
  std::allocator<int>::~allocator((allocator<int> *)&w_3.geometry_.field_0x37);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_288,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_230);
  sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_288);
  sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_230);
  local_ac1 = false;
  if (sVar3 == sVar4) {
    sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_288);
    sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_230);
    local_ac1 = false;
    if (sVar3 == sVar4) {
      piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_288,0);
      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_230,0);
      local_ac1 = piVar5 == piVar6;
    }
  }
  j_1._7_1_ = local_ac1;
  test((bool *)((long)&j_1 + 7));
  j_1._4_2_ = 0;
  while( true ) {
    uVar12 = (ulong)j_1._4_2_;
    sVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1e8);
    if (sVar13 <= uVar12) break;
    sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_288,
                       (ulong)j_1._4_2_);
    sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_230,
                       (ulong)j_1._4_2_);
    j_1._3_1_ = sVar3 == sVar4;
    test((bool *)((long)&j_1 + 3));
    j_1._4_2_ = j_1._4_2_ + 1;
  }
  local_298 = 0;
  while( true ) {
    sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_230);
    if (sVar3 <= local_298) break;
    piVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                       ((View<int,_false,_std::allocator<unsigned_long>_> *)local_288,local_298);
    iVar2 = *piVar5;
    piVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                       ((View<int,_false,_std::allocator<unsigned_long>_> *)local_230,local_298);
    shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = iVar2 == *piVar5;
    test((bool *)((long)&shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_298 = local_298 + 1;
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_288);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_230);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1e8);
  puVar1 = &v_4.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2b8,1,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_4.geometry_.field_0x37);
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2b8,0);
  *pvVar9 = 0x18;
  iVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2b8);
  iVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2b8);
  puVar1 = &w_4.geometry_.field_0x37;
  std::allocator<int>::allocator((allocator<int> *)puVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_300,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar10._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar11._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)puVar1);
  std::allocator<int>::~allocator((allocator<int> *)&w_4.geometry_.field_0x37);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_358,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_300);
  sVar3 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_358);
  sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_300);
  local_b59 = false;
  if (sVar3 == sVar4) {
    sVar3 = andres::View<int,_true,_std::allocator<unsigned_long>_>::size
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_358);
    sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_300);
    local_b59 = false;
    if (sVar3 == sVar4) {
      piVar7 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)local_358,0);
      piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_300,0);
      local_b59 = piVar7 == piVar5;
    }
  }
  j_3._7_1_ = local_b59;
  test((bool *)((long)&j_3 + 7));
  j_3._4_2_ = 0;
  while( true ) {
    uVar12 = (ulong)j_3._4_2_;
    sVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2b8);
    if (sVar13 <= uVar12) break;
    sVar3 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_358,(ulong)j_3._4_2_
                      );
    sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_300,
                       (ulong)j_3._4_2_);
    j_3._3_1_ = sVar3 == sVar4;
    test((bool *)((long)&j_3 + 3));
    j_3._4_2_ = j_3._4_2_ + 1;
  }
  local_368 = 0;
  while( true ) {
    sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_300);
    if (sVar3 <= local_368) break;
    piVar7 = andres::View<int,_true,_std::allocator<unsigned_long>_>::operator()
                       ((View<int,_true,_std::allocator<unsigned_long>_> *)local_358,local_368);
    iVar2 = *piVar7;
    piVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                       ((View<int,_false,_std::allocator<unsigned_long>_> *)local_300,local_368);
    shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = iVar2 == *piVar5;
    test((bool *)((long)&shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_368 = local_368 + 1;
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_358);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_300);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2b8);
  puVar1 = &v_5.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_388,1,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_5.geometry_.field_0x37);
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_388,0);
  *pvVar9 = 0x18;
  iVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_388);
  iVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_388);
  puVar1 = &w_5.geometry_.field_0x37;
  std::allocator<int>::allocator((allocator<int> *)puVar1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_3d0,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar10._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar11._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)puVar1);
  std::allocator<int>::~allocator((allocator<int> *)&w_5.geometry_.field_0x37);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_428,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_3d0);
  sVar3 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_428);
  sVar4 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_3d0);
  local_bf1 = false;
  if (sVar3 == sVar4) {
    sVar3 = andres::View<int,_true,_std::allocator<unsigned_long>_>::size
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_428);
    sVar4 = andres::View<int,_true,_std::allocator<unsigned_long>_>::size
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_3d0);
    local_bf1 = false;
    if (sVar3 == sVar4) {
      piVar7 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)local_428,0);
      piVar8 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)local_3d0,0);
      local_bf1 = piVar7 == piVar8;
    }
  }
  j_5._7_1_ = local_bf1;
  test((bool *)((long)&j_5 + 7));
  j_5._4_2_ = 0;
  while( true ) {
    uVar12 = (ulong)j_5._4_2_;
    sVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_388);
    if (sVar13 <= uVar12) break;
    sVar3 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_428,(ulong)j_5._4_2_
                      );
    sVar4 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_3d0,(ulong)j_5._4_2_
                      );
    j_5._3_1_ = sVar3 == sVar4;
    test((bool *)((long)&j_5 + 3));
    j_5._4_2_ = j_5._4_2_ + 1;
  }
  local_438 = 0;
  while( true ) {
    sVar3 = andres::View<int,_true,_std::allocator<unsigned_long>_>::size
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_3d0);
    if (sVar3 <= local_438) break;
    piVar7 = andres::View<int,_true,_std::allocator<unsigned_long>_>::operator()
                       ((View<int,_true,_std::allocator<unsigned_long>_> *)local_428,local_438);
    iVar2 = *piVar7;
    piVar7 = andres::View<int,_true,_std::allocator<unsigned_long>_>::operator()
                       ((View<int,_true,_std::allocator<unsigned_long>_> *)local_3d0,local_438);
    shape_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = iVar2 == *piVar7;
    test((bool *)((long)&shape_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_438 = local_438 + 1;
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_428);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_3d0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_388);
  puVar1 = &v_6.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_458,2,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_6.geometry_.field_0x37);
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_458,0);
  *pvVar9 = 6;
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_458,1);
  *pvVar9 = 4;
  iVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_458);
  iVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_458);
  puVar1 = &w_6.geometry_.field_0x37;
  std::allocator<int>::allocator((allocator<int> *)puVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_4a0,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar10._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar11._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)puVar1);
  std::allocator<int>::~allocator((allocator<int> *)&w_6.geometry_.field_0x37);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_4f8,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_4a0);
  sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_4f8);
  sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_4a0);
  local_c89 = false;
  if (sVar3 == sVar4) {
    sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_4f8);
    sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_4a0);
    local_c89 = false;
    if (sVar3 == sVar4) {
      piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_4f8,0);
      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_4a0,0);
      local_c89 = piVar5 == piVar6;
    }
  }
  j_7._7_1_ = local_c89;
  test((bool *)((long)&j_7 + 7));
  j_7._4_2_ = 0;
  while( true ) {
    uVar12 = (ulong)j_7._4_2_;
    sVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_458);
    if (sVar13 <= uVar12) break;
    sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_4f8,
                       (ulong)j_7._4_2_);
    sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_4a0,
                       (ulong)j_7._4_2_);
    j_7._3_1_ = sVar3 == sVar4;
    test((bool *)((long)&j_7 + 3));
    j_7._4_2_ = j_7._4_2_ + 1;
  }
  local_508 = 0;
  while( true ) {
    uVar12 = local_508;
    sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_4a0);
    if (sVar3 <= uVar12) break;
    piVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                       ((View<int,_false,_std::allocator<unsigned_long>_> *)local_4f8,local_508);
    iVar2 = *piVar5;
    piVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                       ((View<int,_false,_std::allocator<unsigned_long>_> *)local_4a0,local_508);
    j_8._7_1_ = iVar2 == *piVar5;
    test((bool *)((long)&j_8 + 7));
    local_508 = local_508 + 1;
  }
  k = 0;
  while( true ) {
    sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_4a0,0);
    if (sVar3 <= k) break;
    local_520 = 0;
    while( true ) {
      sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_4a0,1);
      if (sVar3 <= local_520) break;
      piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_4f8,k,local_520);
      iVar2 = *piVar5;
      piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_4a0,k,local_520);
      shape_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = iVar2 == *piVar5;
      test((bool *)((long)&shape_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      local_520 = local_520 + 1;
    }
    k = k + 1;
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_4f8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_4a0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_458);
  puVar1 = &v_7.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_540,2,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_7.geometry_.field_0x37);
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_540,0);
  *pvVar9 = 6;
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_540,1);
  *pvVar9 = 4;
  iVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_540);
  iVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_540);
  puVar1 = &w_7.geometry_.field_0x37;
  std::allocator<int>::allocator((allocator<int> *)puVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_588,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar10._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar11._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)puVar1);
  std::allocator<int>::~allocator((allocator<int> *)&w_7.geometry_.field_0x37);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_5e0,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_588);
  sVar3 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_5e0);
  sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_588);
  local_d59 = false;
  if (sVar3 == sVar4) {
    sVar3 = andres::View<int,_true,_std::allocator<unsigned_long>_>::size
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_5e0);
    sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_588);
    local_d59 = false;
    if (sVar3 == sVar4) {
      piVar7 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)local_5e0,0);
      piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_588,0);
      local_d59 = piVar7 == piVar5;
    }
  }
  j_10._7_1_ = local_d59;
  test((bool *)((long)&j_10 + 7));
  j_10._4_2_ = 0;
  while( true ) {
    uVar12 = (ulong)j_10._4_2_;
    sVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_540);
    if (sVar13 <= uVar12) break;
    sVar3 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_5e0,
                       (ulong)j_10._4_2_);
    sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_588,
                       (ulong)j_10._4_2_);
    j_10._3_1_ = sVar3 == sVar4;
    test((bool *)((long)&j_10 + 3));
    j_10._4_2_ = j_10._4_2_ + 1;
  }
  local_5f0 = 0;
  while( true ) {
    uVar12 = local_5f0;
    sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_588);
    if (sVar3 <= uVar12) break;
    piVar7 = andres::View<int,_true,_std::allocator<unsigned_long>_>::operator()
                       ((View<int,_true,_std::allocator<unsigned_long>_> *)local_5e0,local_5f0);
    iVar2 = *piVar7;
    piVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                       ((View<int,_false,_std::allocator<unsigned_long>_> *)local_588,local_5f0);
    j_11._7_1_ = iVar2 == *piVar5;
    test((bool *)((long)&j_11 + 7));
    local_5f0 = local_5f0 + 1;
  }
  k_1 = 0;
  while( true ) {
    sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_588,0);
    if (sVar3 <= k_1) break;
    local_608 = 0;
    while( true ) {
      sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_588,1);
      if (sVar3 <= local_608) break;
      piVar7 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)local_5e0,k_1,local_608);
      iVar2 = *piVar7;
      piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_588,k_1,local_608);
      shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = iVar2 == *piVar5;
      test((bool *)((long)&shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      local_608 = local_608 + 1;
    }
    k_1 = k_1 + 1;
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_5e0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_588);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_540);
  puVar1 = &v_8.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_628,2,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_8.geometry_.field_0x37);
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_628,0);
  *pvVar9 = 6;
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_628,1);
  *pvVar9 = 4;
  iVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_628);
  iVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_628);
  puVar1 = &w_8.geometry_.field_0x37;
  std::allocator<int>::allocator((allocator<int> *)puVar1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_670,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar10._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar11._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)puVar1);
  std::allocator<int>::~allocator((allocator<int> *)&w_8.geometry_.field_0x37);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_6c8,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_670);
  sVar3 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_6c8);
  sVar4 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_670);
  local_e29 = false;
  if (sVar3 == sVar4) {
    sVar3 = andres::View<int,_true,_std::allocator<unsigned_long>_>::size
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_6c8);
    sVar4 = andres::View<int,_true,_std::allocator<unsigned_long>_>::size
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_670);
    local_e29 = false;
    if (sVar3 == sVar4) {
      piVar7 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)local_6c8,0);
      piVar8 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)local_670,0);
      local_e29 = piVar7 == piVar8;
    }
  }
  j_13._7_1_ = local_e29;
  test((bool *)((long)&j_13 + 7));
  j_13._4_2_ = 0;
  while( true ) {
    uVar12 = (ulong)j_13._4_2_;
    sVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_628);
    if (sVar13 <= uVar12) break;
    sVar3 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_6c8,
                       (ulong)j_13._4_2_);
    sVar4 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_670,
                       (ulong)j_13._4_2_);
    j_13._3_1_ = sVar3 == sVar4;
    test((bool *)((long)&j_13 + 3));
    j_13._4_2_ = j_13._4_2_ + 1;
  }
  local_6d8 = 0;
  while( true ) {
    uVar12 = local_6d8;
    sVar3 = andres::View<int,_true,_std::allocator<unsigned_long>_>::size
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_670);
    if (sVar3 <= uVar12) break;
    piVar7 = andres::View<int,_true,_std::allocator<unsigned_long>_>::operator()
                       ((View<int,_true,_std::allocator<unsigned_long>_> *)local_6c8,local_6d8);
    iVar2 = *piVar7;
    piVar7 = andres::View<int,_true,_std::allocator<unsigned_long>_>::operator()
                       ((View<int,_true,_std::allocator<unsigned_long>_> *)local_670,local_6d8);
    j_14._7_1_ = iVar2 == *piVar7;
    test((bool *)((long)&j_14 + 7));
    local_6d8 = local_6d8 + 1;
  }
  k_2 = 0;
  while( true ) {
    sVar3 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_670,0);
    if (sVar3 <= k_2) break;
    local_6f0 = 0;
    while( true ) {
      sVar3 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                        ((View<int,_true,_std::allocator<unsigned_long>_> *)local_670,1);
      if (sVar3 <= local_6f0) break;
      piVar7 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)local_6c8,k_2,local_6f0);
      iVar2 = *piVar7;
      piVar7 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)local_670,k_2,local_6f0);
      shape_6.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = iVar2 == *piVar7;
      test((bool *)((long)&shape_6.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      local_6f0 = local_6f0 + 1;
    }
    k_2 = k_2 + 1;
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_6c8);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_670);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_628);
  puVar1 = &v_9.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_710,3,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_9.geometry_.field_0x37);
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_710,0);
  *pvVar9 = 3;
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_710,1);
  *pvVar9 = 4;
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_710,2);
  *pvVar9 = 2;
  iVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_710);
  iVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_710);
  puVar1 = &w_9.geometry_.field_0x37;
  std::allocator<int>::allocator((allocator<int> *)puVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_758,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar10._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar11._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)puVar1);
  std::allocator<int>::~allocator((allocator<int> *)&w_9.geometry_.field_0x37);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_7b0,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_758);
  sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_7b0);
  sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_758);
  local_ef9 = false;
  if (sVar3 == sVar4) {
    sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_7b0);
    sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_758);
    local_ef9 = false;
    if (sVar3 == sVar4) {
      piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_7b0,0);
      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_758,0);
      local_ef9 = piVar5 == piVar6;
    }
  }
  j_16._7_1_ = local_ef9;
  test((bool *)((long)&j_16 + 7));
  j_16._4_2_ = 0;
  while( true ) {
    uVar12 = (ulong)j_16._4_2_;
    sVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_710);
    if (sVar13 <= uVar12) break;
    sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_7b0,
                       (ulong)j_16._4_2_);
    sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_758,
                       (ulong)j_16._4_2_);
    j_16._3_1_ = sVar3 == sVar4;
    test((bool *)((long)&j_16 + 3));
    j_16._4_2_ = j_16._4_2_ + 1;
  }
  local_7c0 = 0;
  while( true ) {
    uVar12 = local_7c0;
    sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_758);
    if (sVar3 <= uVar12) break;
    piVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                       ((View<int,_false,_std::allocator<unsigned_long>_> *)local_7b0,local_7c0);
    iVar2 = *piVar5;
    piVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                       ((View<int,_false,_std::allocator<unsigned_long>_> *)local_758,local_7c0);
    j_17._7_1_ = iVar2 == *piVar5;
    test((bool *)((long)&j_17 + 7));
    local_7c0 = local_7c0 + 1;
  }
  k_3 = 0;
  while( true ) {
    sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_758,0);
    if (sVar3 <= k_3) break;
    p = 0;
    while( true ) {
      sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_758,1);
      if (sVar3 <= p) break;
      local_7e0 = 0;
      while( true ) {
        sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_758,2);
        if (sVar3 <= local_7e0) break;
        piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)local_758,k_3,p,
                            local_7e0);
        iVar2 = *piVar5;
        piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)local_7b0,k_3,p,
                            local_7e0);
        shape_7.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = iVar2 == *piVar5;
        test((bool *)((long)&shape_7.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        local_7e0 = local_7e0 + 1;
      }
      p = p + 1;
    }
    k_3 = k_3 + 1;
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_7b0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_758);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_710);
  puVar1 = &v_10.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_800,3,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_10.geometry_.field_0x37);
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_800,0);
  *pvVar9 = 3;
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_800,1);
  *pvVar9 = 4;
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_800,2);
  *pvVar9 = 2;
  iVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_800);
  iVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_800);
  puVar1 = &w_10.geometry_.field_0x37;
  std::allocator<int>::allocator((allocator<int> *)puVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_848,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar10._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar11._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)puVar1);
  std::allocator<int>::~allocator((allocator<int> *)&w_10.geometry_.field_0x37);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_8a0,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_848);
  sVar3 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_8a0);
  sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_848);
  local_fd9 = false;
  if (sVar3 == sVar4) {
    sVar3 = andres::View<int,_true,_std::allocator<unsigned_long>_>::size
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_8a0);
    sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_848);
    local_fd9 = false;
    if (sVar3 == sVar4) {
      piVar7 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)local_8a0,0);
      piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_848,0);
      local_fd9 = piVar7 == piVar5;
    }
  }
  j_19._7_1_ = local_fd9;
  test((bool *)((long)&j_19 + 7));
  j_19._4_2_ = 0;
  while( true ) {
    uVar12 = (ulong)j_19._4_2_;
    sVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_800);
    if (sVar13 <= uVar12) break;
    sVar3 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_8a0,
                       (ulong)j_19._4_2_);
    sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_848,
                       (ulong)j_19._4_2_);
    j_19._3_1_ = sVar3 == sVar4;
    test((bool *)((long)&j_19 + 3));
    j_19._4_2_ = j_19._4_2_ + 1;
  }
  local_8b0 = 0;
  while( true ) {
    uVar12 = local_8b0;
    sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_848);
    if (sVar3 <= uVar12) break;
    piVar7 = andres::View<int,_true,_std::allocator<unsigned_long>_>::operator()
                       ((View<int,_true,_std::allocator<unsigned_long>_> *)local_8a0,local_8b0);
    iVar2 = *piVar7;
    piVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                       ((View<int,_false,_std::allocator<unsigned_long>_> *)local_848,local_8b0);
    j_20._7_1_ = iVar2 == *piVar5;
    test((bool *)((long)&j_20 + 7));
    local_8b0 = local_8b0 + 1;
  }
  k_4 = 0;
  while( true ) {
    sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_848,0);
    if (sVar3 <= k_4) break;
    p_1 = 0;
    while( true ) {
      sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_848,1);
      if (sVar3 <= p_1) break;
      local_8d0 = 0;
      while( true ) {
        sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_848,2);
        if (sVar3 <= local_8d0) break;
        piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)local_848,k_4,p_1,
                            local_8d0);
        iVar2 = *piVar5;
        piVar7 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                           ((View<int,true,std::allocator<unsigned_long>> *)local_8a0,k_4,p_1,
                            local_8d0);
        shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = iVar2 == *piVar7;
        test((bool *)((long)&shape_8.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        local_8d0 = local_8d0 + 1;
      }
      p_1 = p_1 + 1;
    }
    k_4 = k_4 + 1;
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_8a0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_848);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_800);
  puVar1 = &v_11.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_8f0,3,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_11.geometry_.field_0x37);
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_8f0,0);
  *pvVar9 = 3;
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_8f0,1);
  *pvVar9 = 4;
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_8f0,2);
  *pvVar9 = 2;
  iVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_8f0);
  iVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_8f0);
  puVar1 = &w_11.geometry_.field_0x37;
  std::allocator<int>::allocator((allocator<int> *)puVar1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_938,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar10._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar11._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)puVar1);
  std::allocator<int>::~allocator((allocator<int> *)&w_11.geometry_.field_0x37);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_990,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_938);
  sVar3 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_990);
  sVar4 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_938);
  local_10b9 = false;
  if (sVar3 == sVar4) {
    sVar3 = andres::View<int,_true,_std::allocator<unsigned_long>_>::size
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_990);
    sVar4 = andres::View<int,_true,_std::allocator<unsigned_long>_>::size
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_938);
    local_10b9 = false;
    if (sVar3 == sVar4) {
      piVar7 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)local_990,0);
      piVar8 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)local_938,0);
      local_10b9 = piVar7 == piVar8;
    }
  }
  j_22._7_1_ = local_10b9;
  test((bool *)((long)&j_22 + 7));
  j_22._4_2_ = 0;
  while( true ) {
    uVar12 = (ulong)j_22._4_2_;
    sVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_8f0);
    if (sVar13 <= uVar12) break;
    sVar3 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_990,
                       (ulong)j_22._4_2_);
    sVar4 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_938,
                       (ulong)j_22._4_2_);
    j_22._3_1_ = sVar3 == sVar4;
    test((bool *)((long)&j_22 + 3));
    j_22._4_2_ = j_22._4_2_ + 1;
  }
  local_9a0 = 0;
  while( true ) {
    uVar12 = local_9a0;
    sVar3 = andres::View<int,_true,_std::allocator<unsigned_long>_>::size
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_938);
    if (sVar3 <= uVar12) break;
    piVar7 = andres::View<int,_true,_std::allocator<unsigned_long>_>::operator()
                       ((View<int,_true,_std::allocator<unsigned_long>_> *)local_990,local_9a0);
    iVar2 = *piVar7;
    piVar7 = andres::View<int,_true,_std::allocator<unsigned_long>_>::operator()
                       ((View<int,_true,_std::allocator<unsigned_long>_> *)local_938,local_9a0);
    j_23._7_1_ = iVar2 == *piVar7;
    test((bool *)((long)&j_23 + 7));
    local_9a0 = local_9a0 + 1;
  }
  k_5 = 0;
  while( true ) {
    sVar3 = k_5;
    sVar4 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_938,0);
    if (sVar4 <= sVar3) break;
    p_2 = 0;
    while( true ) {
      sVar3 = p_2;
      sVar4 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                        ((View<int,_true,_std::allocator<unsigned_long>_> *)local_938,1);
      if (sVar4 <= sVar3) break;
      local_9c0 = 0;
      while( true ) {
        uVar12 = local_9c0;
        sVar3 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_938,2);
        if (sVar3 <= uVar12) break;
        piVar7 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                           ((View<int,true,std::allocator<unsigned_long>> *)local_938,k_5,p_2,
                            local_9c0);
        iVar2 = *piVar7;
        piVar7 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                           ((View<int,true,std::allocator<unsigned_long>> *)local_990,k_5,p_2,
                            local_9c0);
        local_9c1 = iVar2 == *piVar7;
        test(&local_9c1);
        local_9c0 = local_9c0 + 1;
      }
      p_2 = p_2 + 1;
    }
    k_5 = k_5 + 1;
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_990);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_938);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_8f0);
  return;
}

Assistant:

void ViewTest::copyConstructorTest() {
    // scalar 
    {
        // false, false
        {
            andres::View<int, false> v(&scalar_);
            andres::View<int, false> w(v);

            test(w.dimension() == v.dimension() &&
                   w.size() == v.size() &&
                   &(w(0)) == &(v(0)));
        }
        // false, true
        {
            andres::View<int, false> v(&scalar_);
            andres::View<int, true> w(v);

            test(w.dimension() == v.dimension() &&
                   w.size() == v.size() &&
                   &(w(0)) == &(v(0)));
        }
        // true, true
        {
            andres::View<int, true> v(&scalar_);
            andres::View<int, true> w(v);

            test(w.dimension() == v.dimension() &&
                   w.size() == v.size() &&
                   &(w(0)) == &(v(0)));
        }
    }
    // 1D 
    {
        // false, false
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24;
            andres::View<int, false> v(shape.begin(), shape.end(), data_);
            andres::View<int, false> w(v);

            test(w.dimension() == v.dimension() &&
                   w.size() == v.size() &&
                   &(w(0)) == &(v(0))
            );
            for(unsigned short j=0; j<shape.size(); ++j) {
                test(w.shape(j) == v.shape(j));
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(w(j) == v(j));
            }
        }
        // false, true
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24;
            andres::View<int, false> v(shape.begin(), shape.end(), data_);
            andres::View<int, true> w(v);

            test(w.dimension() == v.dimension() &&
                   w.size() == v.size() &&
                   &(w(0)) == &(v(0))
            );
            for(unsigned short j=0; j<shape.size(); ++j) {
                test(w.shape(j) == v.shape(j));
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(w(j) == v(j));
            }
        }
        // true, true
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24;
            andres::View<int, true> v(shape.begin(), shape.end(), data_);
            andres::View<int, true> w(v);

            test(w.dimension() == v.dimension() &&
                   w.size() == v.size() &&
                   &(w(0)) == &(v(0))
            );
            for(unsigned short j=0; j<shape.size(); ++j) {
                test(w.shape(j) == v.shape(j));
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(w(j) == v(j));
            }
        }
    }
    // 2D 
    {
        // false, false
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6;
            shape[1] = 4;
            andres::View<int> v(shape.begin(), shape.end(), data_);
            andres::View<int> w(v);

            test(w.dimension() == v.dimension() &&
                   w.size() == v.size() &&
                   &(w(0)) == &(v(0))
            );
            for(unsigned short j=0; j<shape.size(); ++j) {
                test(w.shape(j) == v.shape(j));
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(w(j) == v(j));
            }
            for(std::size_t j=0; j<v.shape(0); ++j) {
                for(std::size_t k=0; k<v.shape(1); ++k) {
                    test(w(j, k) == v(j, k));
                }
            }
        }
        // false, true
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6;
            shape[1] = 4;
            andres::View<int, false> v(shape.begin(), shape.end(), data_);
            andres::View<int, true> w(v);

            test(w.dimension() == v.dimension() &&
                   w.size() == v.size() &&
                   &(w(0)) == &(v(0))
            );
            for(unsigned short j=0; j<shape.size(); ++j) {
                test(w.shape(j) == v.shape(j));
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(w(j) == v(j));
            }
            for(std::size_t j=0; j<v.shape(0); ++j) {
                for(std::size_t k=0; k<v.shape(1); ++k) {
                    test(w(j, k) == v(j, k));
                }
            }
        }
        // true, true
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6;
            shape[1] = 4;
            andres::View<int, true> v(shape.begin(), shape.end(), data_);
            andres::View<int, true> w(v);
            
            test(w.dimension() == v.dimension() &&
                   w.size() == v.size() &&
                   &(w(0)) == &(v(0))
            );
            for(unsigned short j=0; j<shape.size(); ++j) {
                test(w.shape(j) == v.shape(j));
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(w(j) == v(j));
            }
            for(std::size_t j=0; j<v.shape(0); ++j) {
                for(std::size_t k=0; k<v.shape(1); ++k) {
                    test(w(j, k) == v(j, k));
                }
            }
        }
    }
    // 3D 
    {
        // false, false
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, false> v(shape.begin(), shape.end(), data_);
            andres::View<int, false> w(v);
            
            test(w.dimension() == v.dimension() &&
                   w.size() == v.size() &&
                   &(w(0)) == &(v(0))
            );
            for(unsigned short j=0; j<shape.size(); ++j) {
                test(w.shape(j) == v.shape(j));
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(w(j) == v(j));
            }
            for(std::size_t j=0; j<v.shape(0); ++j) {
                for(std::size_t k=0; k<v.shape(1); ++k) {
                    for(std::size_t p=0; p<v.shape(2); ++p) {
                        test(v(j, k, p) == w(j, k, p));
                    }
                }
            }
        }
        // false, true
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, false> v(shape.begin(), shape.end(), data_);
            andres::View<int, true> w(v);
            
            test(w.dimension() == v.dimension() &&
                   w.size() == v.size() &&
                   &(w(0)) == &(v(0))
            );
            for(unsigned short j=0; j<shape.size(); ++j) {
                test(w.shape(j) == v.shape(j));
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(w(j) == v(j));
            }
            for(std::size_t j=0; j<v.shape(0); ++j) {
                for(std::size_t k=0; k<v.shape(1); ++k) {
                    for(std::size_t p=0; p<v.shape(2); ++p) {
                        test(v(j, k, p) == w(j, k, p));
                    }
                }
            }
        }
        // true, true
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, true> v(shape.begin(), shape.end(), data_);
            andres::View<int, true> w(v);
            
            test(w.dimension() == v.dimension() &&
                   w.size() == v.size() &&
                   &(w(0)) == &(v(0))
            );
            for(unsigned short j=0; j<shape.size(); ++j) {
                test(w.shape(j) == v.shape(j));
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(w(j) == v(j));
            }
            for(std::size_t j=0; j<v.shape(0); ++j) {
                for(std::size_t k=0; k<v.shape(1); ++k) {
                    for(std::size_t p=0; p<v.shape(2); ++p) {
                        test(v(j, k, p) == w(j, k, p));
                    }
                }
            }
        }
    }
}